

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_uncomp_copy(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  do {
    uVar2 = copysample(strm);
    if (uVar2 == 0) {
      return 0;
    }
    uVar2 = piVar1->sample_counter - 1;
    piVar1->sample_counter = uVar2;
  } while (uVar2 != 0);
  piVar1->mode = m_next_cds;
  return 1;
}

Assistant:

static int m_uncomp_copy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (copysample(strm) == 0)
            return M_EXIT;
    } while(--state->sample_counter);

    state->mode = m_next_cds;
    return M_CONTINUE;
}